

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int convert_bits(uint8_t *out,size_t *outlen,int outbits,uint8_t *in,size_t inlen,int inbits,int pad
                )

{
  size_t sVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  int local_44;
  uint32_t maxv;
  int bits;
  uint32_t val;
  int inbits_local;
  size_t inlen_local;
  uint8_t *in_local;
  int outbits_local;
  size_t *outlen_local;
  uint8_t *out_local;
  
  maxv = 0;
  local_44 = 0;
  bVar4 = (byte)outbits;
  uVar3 = (1 << (bVar4 & 0x1f)) - 1;
  _val = inlen;
  inlen_local = (size_t)in;
  while( true ) {
    sVar5 = _val - 1;
    bVar2 = (byte)uVar3;
    if (_val == 0) break;
    sVar6 = inlen_local + 1;
    maxv = maxv << ((byte)inbits & 0x1f) | (uint)*(byte *)inlen_local;
    local_44 = inbits + local_44;
    while (_val = sVar5, inlen_local = sVar6, outbits <= local_44) {
      local_44 = local_44 - outbits;
      sVar1 = *outlen;
      *outlen = sVar1 + 1;
      out[sVar1] = (byte)(maxv >> ((byte)local_44 & 0x1f)) & bVar2;
    }
  }
  if (pad == 0) {
    if (((maxv << (bVar4 - (char)local_44 & 0x1f) & uVar3) != 0) || (inbits <= local_44)) {
      return 0;
    }
  }
  else if (local_44 != 0) {
    sVar5 = *outlen;
    *outlen = sVar5 + 1;
    out[sVar5] = (byte)(maxv << (bVar4 - (char)local_44 & 0x1f)) & bVar2;
  }
  return 1;
}

Assistant:

static int convert_bits(uint8_t *out, size_t *outlen, int outbits, const uint8_t *in, size_t inlen, int inbits, int pad) {
    uint32_t val = 0;
    int bits = 0;
    uint32_t maxv = (((uint32_t)1) << outbits) - 1;
    while (inlen--) {
        val = (val << inbits) | *(in++);
        bits += inbits;
        while (bits >= outbits) {
            bits -= outbits;
            out[(*outlen)++] = (val >> bits) & maxv;
        }
    }
    if (pad) {
        if (bits) {
            out[(*outlen)++] = (val << (outbits - bits)) & maxv;
        }
    } else if (((val << (outbits - bits)) & maxv) || bits >= inbits) {
        return 0;
    }
    return 1;
}